

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void __thiscall
brotli::HashToBinaryTree::Init
          (HashToBinaryTree *this,int lgwin,size_t position,size_t bytes,bool is_last)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint32_t *puVar3;
  size_t local_48;
  size_t num_nodes;
  uint32_t i;
  bool is_last_local;
  size_t bytes_local;
  size_t position_local;
  int lgwin_local;
  HashToBinaryTree *this_local;
  
  if ((this->need_init_ & 1U) != 0) {
    this->window_mask_ = (ulong)((1 << ((byte)lgwin & 0x1f)) - 1);
    this->invalid_pos_ = -(int)this->window_mask_;
    for (num_nodes._0_4_ = 0; (uint)num_nodes < 0x20000; num_nodes._0_4_ = (uint)num_nodes + 1) {
      this->buckets_[(uint)num_nodes] = this->invalid_pos_;
    }
    if ((position != 0) || (local_48 = bytes, !is_last)) {
      local_48 = this->window_mask_ + 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_48 << 1;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    puVar3 = (uint32_t *)operator_new__(uVar2);
    this->forest_ = puVar3;
    this->need_init_ = false;
  }
  return;
}

Assistant:

void Init(int lgwin, size_t position, size_t bytes, bool is_last) {
    if (need_init_) {
      window_mask_ = (1u << lgwin) - 1u;
      invalid_pos_ = static_cast<uint32_t>(-window_mask_);
      for (uint32_t i = 0; i < kBucketSize; i++) {
        buckets_[i] = invalid_pos_;
      }
      size_t num_nodes = (position == 0 && is_last) ? bytes : window_mask_ + 1;
      forest_ = new uint32_t[2 * num_nodes];
      need_init_ = false;
    }
  }